

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O0

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long *in_RSI;
  long in_RDI;
  double dVar2;
  int j_11;
  int j_10;
  float sum_4;
  int j_9;
  float max_4;
  int i_19;
  float *ptr_17;
  int q_6;
  int channels_2;
  int h_4;
  int w_5;
  int j_8;
  int i_18;
  float *sumptr_1;
  float *ptr_16;
  int q_5;
  int j_7;
  int i_17;
  float *sumptr;
  float *maxptr_1;
  float *ptr_15;
  int q_4;
  Mat sum_3;
  int j_6;
  int i_15;
  float *maxptr;
  float *ptr_13;
  int q_3;
  Mat max_3;
  int channels_1;
  int h_3;
  int w_4;
  int i_13;
  float *ptr_11;
  int q_2;
  int i_12;
  float *ptr_10;
  int q_1;
  Mat sum_2;
  int i_10;
  float *ptr_8;
  int q;
  Mat max_2;
  int size_2;
  int channels;
  int h_2;
  int w_3;
  int j_5;
  int j_4;
  float s;
  int j_3;
  float m;
  float *ptr_6;
  int i_8;
  int h_1;
  int w_2;
  int j_2;
  float *ptr_5;
  int i_7;
  int j_1;
  float *ptr_4;
  int i_6;
  Mat sum_1;
  int j;
  float *ptr_2;
  int i_4;
  Mat max_1;
  int h;
  int w_1;
  int i_2;
  int i_1;
  float sum;
  int i;
  float max;
  float *ptr;
  int w;
  int positive_axis;
  size_t elemsize;
  int dims;
  int i_16;
  float *ptr_14;
  int size_6;
  int i_14;
  float *ptr_12;
  int size_5;
  int i_11;
  float *ptr_9;
  int size_4;
  int i_9;
  float *ptr_7;
  int size_3;
  int i_5;
  float *ptr_3;
  int size_1;
  int i_3;
  float *ptr_1;
  int size;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Allocator *in_stack_ffffffffffffedd8;
  size_t in_stack_ffffffffffffede0;
  undefined8 in_stack_ffffffffffffede8;
  Mat *in_stack_ffffffffffffedf0;
  int local_f1c;
  int local_f10;
  int local_f0c;
  float local_f08;
  int local_f04;
  float local_f00;
  int local_efc;
  undefined8 local_ef8;
  undefined8 local_ef0;
  undefined8 local_ee8;
  undefined4 local_ee0;
  long local_ed8;
  undefined4 local_ed0;
  undefined4 local_ecc;
  undefined4 local_ec8;
  undefined4 local_ec4;
  undefined4 local_ec0;
  undefined8 local_eb8;
  long local_eb0;
  int local_ea8;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  int local_e98;
  int local_e94;
  undefined4 *local_e90;
  undefined8 local_e88;
  undefined8 local_e80;
  undefined8 local_e78;
  undefined4 local_e70;
  long local_e68;
  undefined4 local_e60;
  undefined4 local_e5c;
  undefined4 local_e58;
  undefined4 local_e54;
  undefined4 local_e50;
  undefined8 local_e48;
  long local_e40;
  int local_e34;
  int local_e30;
  int local_e2c;
  undefined4 *local_e28;
  undefined4 *local_e20;
  undefined8 local_e18;
  undefined8 local_e10;
  undefined8 local_e08;
  undefined4 local_e00;
  long local_df8;
  undefined4 local_df0;
  undefined4 local_dec;
  undefined4 local_de8;
  undefined4 local_de4;
  undefined4 local_de0;
  undefined8 local_dd8;
  long local_dd0;
  int local_dc4;
  undefined4 *local_dc0;
  int *local_db8;
  long local_db0;
  undefined4 local_da8;
  long *local_da0;
  undefined4 local_d98;
  int local_d94;
  undefined4 local_d90;
  undefined4 local_d8c;
  int local_d88;
  long local_d80;
  int local_d78;
  int local_d74;
  undefined4 *local_d70;
  undefined8 local_d68;
  undefined8 local_d60;
  undefined8 local_d58;
  undefined4 local_d50;
  long local_d48;
  undefined4 local_d40;
  undefined4 local_d3c;
  undefined4 local_d38;
  undefined4 local_d34;
  undefined4 local_d30;
  undefined8 local_d28;
  long local_d20;
  int local_d14;
  undefined4 *local_d10;
  int *local_d08;
  long local_d00;
  undefined4 local_cf8;
  long *local_cf0;
  undefined4 local_ce8;
  int local_ce4;
  undefined4 local_ce0;
  undefined4 local_cdc;
  int local_cd8;
  long local_cd0;
  int local_cc8;
  int local_cc4;
  int local_cc0;
  int local_cbc;
  undefined8 local_cb8;
  undefined8 local_cb0;
  undefined8 local_ca8;
  undefined4 local_ca0;
  long local_c98;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  undefined4 local_c84;
  undefined4 local_c80;
  undefined8 local_c78;
  long local_c70;
  int local_c68;
  int local_c64;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 local_c50;
  undefined4 local_c48;
  long local_c40;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  undefined8 local_c20;
  long local_c18;
  int local_c0c;
  undefined4 *local_c08;
  int *local_c00;
  undefined8 local_bf8;
  undefined4 local_bf0;
  long *local_be8;
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  int local_bd0;
  long local_bc8;
  int local_bbc;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined8 local_ba8;
  undefined4 local_ba0;
  long local_b98;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined8 local_b78;
  long local_b70;
  int local_b64;
  undefined4 *local_b60;
  int *local_b58;
  undefined8 local_b50;
  undefined4 local_b48;
  long *local_b40;
  undefined4 local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 local_b2c;
  int local_b28;
  long local_b20;
  int local_b14;
  int local_b10;
  int local_b0c;
  int local_b08;
  int local_b04;
  int local_b00;
  float local_afc;
  int local_af8;
  float local_af4;
  long local_af0;
  int local_ae8;
  int local_ae4;
  int local_ae0;
  int local_adc;
  long local_ad8;
  int local_ad0;
  int local_acc;
  long local_ac8;
  int local_abc;
  undefined4 *local_ab8;
  int *local_ab0;
  undefined8 local_aa8;
  undefined4 local_aa0;
  long *local_a98;
  undefined4 local_a90;
  undefined4 local_a8c;
  undefined4 local_a88;
  undefined4 local_a84;
  int local_a80;
  long local_a78;
  int local_a6c;
  long local_a68;
  int local_a5c;
  int local_a58;
  undefined4 *local_a48;
  int *local_a40;
  undefined8 local_a38;
  undefined4 local_a30;
  long *local_a28;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  int local_a10;
  long local_a08;
  int local_9fc;
  int local_9f8;
  int local_9f4;
  int local_9f0;
  float local_9ec;
  int local_9e8;
  float local_9e4;
  long local_9e0;
  int local_9d8;
  int local_9d4;
  long local_9d0;
  int local_9c4;
  long *local_9b8;
  int local_9a4;
  undefined8 *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined4 **local_970;
  undefined4 **local_968;
  undefined4 **local_960;
  undefined4 **local_958;
  undefined4 **local_950;
  undefined4 **local_948;
  undefined4 **local_940;
  undefined4 **local_938;
  undefined4 **local_930;
  undefined4 **local_928;
  undefined4 **local_920;
  undefined4 **local_918;
  int local_90c;
  undefined4 *local_908;
  int local_900;
  undefined4 local_8fc;
  undefined4 **local_8f8;
  int local_8ec;
  undefined4 *local_8e8;
  int local_8e0;
  undefined4 local_8dc;
  undefined4 **local_8d8;
  int local_8cc;
  undefined4 *local_8c8;
  int local_8c0;
  undefined4 local_8bc;
  undefined4 **local_8b8;
  int local_8ac;
  undefined4 *local_8a8;
  int local_8a0;
  undefined4 local_89c;
  undefined4 **local_898;
  int local_88c;
  undefined4 *local_888;
  int local_880;
  undefined4 local_87c;
  undefined4 **local_878;
  int local_86c;
  undefined4 *local_868;
  int local_860;
  undefined4 local_85c;
  undefined4 **local_858;
  int local_84c;
  undefined4 **local_848;
  int local_83c;
  undefined4 **local_838;
  int local_82c;
  undefined4 **local_828;
  int local_81c;
  undefined4 **local_818;
  int local_80c;
  long *local_808;
  int local_7fc;
  int local_7ec;
  long *local_7e8;
  int local_7dc;
  long *local_7d8;
  long local_7d0;
  undefined4 **local_7c8;
  long local_7c0;
  undefined4 **local_7b8;
  long local_7b0;
  undefined4 **local_7a8;
  long local_7a0;
  undefined4 **local_798;
  long local_790;
  undefined4 **local_788;
  long local_780;
  undefined4 **local_778;
  long local_770;
  undefined4 **local_768;
  long local_760;
  undefined4 **local_758;
  long local_750;
  undefined4 **local_748;
  long local_740;
  undefined4 **local_738;
  undefined4 **local_730;
  undefined4 **local_720;
  undefined8 *local_710;
  undefined8 *local_700;
  undefined8 *local_6f0;
  undefined4 **local_6e0;
  undefined4 **local_6d0;
  undefined8 *local_6c0;
  undefined8 *local_6b0;
  undefined8 *local_6a0;
  undefined4 **local_690;
  undefined4 **local_680;
  undefined8 *local_670;
  undefined1 local_65d;
  int local_65c;
  undefined8 *local_650;
  undefined1 local_63d;
  int local_63c;
  undefined8 *local_630;
  undefined1 local_61d;
  int local_61c;
  undefined8 *local_610;
  undefined1 local_5fd;
  int local_5fc;
  undefined8 *local_5f0;
  undefined1 local_5dd;
  int local_5dc;
  undefined8 *local_5d0;
  undefined1 local_5bd;
  int local_5bc;
  undefined8 *local_5b0;
  undefined1 local_59d;
  int local_59c;
  undefined8 *local_590;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined4 **local_570;
  undefined4 **local_568;
  undefined4 **local_560;
  undefined4 **local_558;
  undefined4 **local_550;
  undefined4 **local_548;
  undefined4 **local_540;
  undefined4 **local_538;
  undefined4 **local_530;
  undefined4 **local_528;
  undefined4 **local_520;
  undefined4 **local_518;
  undefined8 *local_488;
  int local_470;
  undefined4 local_46c;
  undefined4 **local_468;
  int local_450;
  undefined4 local_44c;
  undefined4 **local_448;
  undefined8 *local_428;
  undefined8 *local_408;
  undefined8 *local_3e8;
  int local_3d0;
  undefined4 local_3cc;
  undefined4 **local_3c8;
  int local_3b0;
  undefined4 local_3ac;
  undefined4 **local_3a8;
  undefined8 *local_388;
  undefined8 *local_368;
  undefined8 *local_348;
  int local_330;
  undefined4 local_32c;
  undefined4 **local_328;
  int local_310;
  undefined4 local_30c;
  undefined4 **local_308;
  undefined4 *local_300;
  undefined4 *local_2f0;
  undefined4 *local_2b0;
  undefined4 *local_2a0;
  undefined4 *local_260;
  undefined4 *local_250;
  long local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  long local_1e0;
  undefined4 local_1d4;
  int local_1d0;
  int local_1cc;
  undefined8 *local_1c8;
  long local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  long local_1a8;
  undefined4 local_19c;
  int local_198;
  int local_194;
  undefined8 *local_190;
  long local_188;
  undefined4 local_17c;
  long local_178;
  long local_170;
  undefined4 local_164;
  int local_160;
  int local_15c;
  undefined8 *local_158;
  long local_150;
  undefined4 local_144;
  long local_140;
  long local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  long local_118;
  undefined4 local_10c;
  long local_108;
  long local_100;
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  undefined8 *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  long local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  long local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_9c4 = (int)in_RSI[5];
  local_9d0 = in_RSI[2];
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_f1c = local_9c4 + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_f1c = *(int *)(in_RDI + 0xd0);
  }
  local_9d4 = local_f1c;
  local_9b8 = in_RSI;
  if (local_9c4 == 1) {
    local_9d8 = *(int *)((long)in_RSI + 0x2c);
    local_9e0 = *in_RSI;
    local_9e4 = -3.4028235e+38;
    for (local_9e8 = 0; local_9e8 < local_9d8; local_9e8 = local_9e8 + 1) {
      pfVar1 = std::max<float>(&local_9e4,(float *)(local_9e0 + (long)local_9e8 * 4));
      local_9e4 = *pfVar1;
    }
    local_9ec = 0.0;
    for (local_9f0 = 0; local_9f0 < local_9d8; local_9f0 = local_9f0 + 1) {
      dVar2 = std::exp((double)(ulong)(uint)(*(float *)(local_9e0 + (long)local_9f0 * 4) - local_9e4
                                            ));
      *(int *)(local_9e0 + (long)local_9f0 * 4) = SUB84(dVar2,0);
      local_9ec = *(float *)(local_9e0 + (long)local_9f0 * 4) + local_9ec;
    }
    for (local_9f4 = 0; local_9f4 < local_9d8; local_9f4 = local_9f4 + 1) {
      *(float *)(local_9e0 + (long)local_9f4 * 4) =
           *(float *)(local_9e0 + (long)local_9f4 * 4) / local_9ec;
    }
  }
  if ((local_9c4 == 2) && (local_9d4 == 0)) {
    local_9f8 = *(int *)((long)local_9b8 + 0x2c);
    local_9fc = (int)local_9b8[6];
    local_970 = &local_a48;
    local_a48 = (undefined4 *)0x0;
    local_a40 = (int *)0x0;
    local_a38 = 0;
    local_a30 = 0;
    local_a28 = (long *)0x0;
    local_a20 = 0;
    local_a1c = 0;
    local_a18 = 0;
    local_a14 = 0;
    local_a10 = 0;
    local_a08 = 0;
    Mat::create(in_stack_ffffffffffffedf0,(int)((ulong)in_stack_ffffffffffffede8 >> 0x20),
                in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    local_918 = &local_a48;
    if (local_a48 != (undefined4 *)0x0) {
      local_540 = local_918;
    }
    if (local_a48 != (undefined4 *)0x0 && local_a08 * local_a10 != 0) {
      local_858 = &local_a48;
      local_85c = 0xff7fffff;
      local_860 = (int)local_a08 * local_a10;
      local_868 = local_a48;
      for (local_86c = 0; local_86c < local_860; local_86c = local_86c + 1) {
        *local_868 = 0xff7fffff;
        local_868 = local_868 + 1;
      }
      local_570 = local_858;
      for (local_a5c = 0; local_a5c < local_9fc; local_a5c = local_a5c + 1) {
        local_7d8 = local_9b8;
        local_7dc = local_a5c;
        local_a68 = *local_9b8 +
                    (long)*(int *)((long)local_9b8 + 0x2c) * (long)local_a5c * local_9b8[2];
        for (local_a6c = 0; local_a6c < local_9f8; local_a6c = local_a6c + 1) {
          local_740 = (long)local_a6c;
          local_738 = &local_a48;
          pfVar1 = std::max<float>((float *)(local_a48 + local_740),
                                   (float *)(local_a68 + (long)local_a6c * 4));
          local_750 = (long)local_a6c;
          local_748 = &local_a48;
          local_a48[local_750] = *pfVar1;
        }
      }
      local_968 = &local_ab8;
      local_ab8 = (undefined4 *)0x0;
      local_ab0 = (int *)0x0;
      local_aa8 = 0;
      local_aa0 = 0;
      local_a98 = (long *)0x0;
      local_a90 = 0;
      local_a8c = 0;
      local_a88 = 0;
      local_a84 = 0;
      local_a80 = 0;
      local_a78 = 0;
      Mat::create(in_stack_ffffffffffffedf0,(int)((ulong)in_stack_ffffffffffffede8 >> 0x20),
                  in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
      local_920 = &local_ab8;
      if (local_ab8 != (undefined4 *)0x0) {
        local_538 = local_920;
      }
      if (local_ab8 != (undefined4 *)0x0 && local_a78 * local_a80 != 0) {
        local_878 = &local_ab8;
        local_87c = 0;
        local_880 = (int)local_a78 * local_a80;
        local_888 = local_ab8;
        for (local_88c = 0; local_88c < local_880; local_88c = local_88c + 1) {
          *local_888 = 0;
          local_888 = local_888 + 1;
        }
        local_568 = local_878;
        for (local_abc = 0; local_abc < local_9fc; local_abc = local_abc + 1) {
          local_7e8 = local_9b8;
          local_7ec = local_abc;
          local_ac8 = *local_9b8 +
                      (long)*(int *)((long)local_9b8 + 0x2c) * (long)local_abc * local_9b8[2];
          for (local_acc = 0; local_acc < local_9f8; local_acc = local_acc + 1) {
            local_760 = (long)local_acc;
            local_758 = &local_a48;
            dVar2 = std::exp((double)(ulong)(uint)(*(float *)(local_ac8 + (long)local_acc * 4) -
                                                  (float)local_a48[local_760]));
            *(int *)(local_ac8 + (long)local_acc * 4) = SUB84(dVar2,0);
            local_770 = (long)local_acc;
            local_768 = &local_ab8;
            local_ab8[local_770] =
                 *(float *)(local_ac8 + (long)local_acc * 4) + (float)local_ab8[local_770];
          }
        }
        for (local_ad0 = 0; local_ad0 < local_9fc; local_ad0 = local_ad0 + 1) {
          local_7fc = local_ad0;
          local_ad8 = *local_9b8 +
                      (long)*(int *)((long)local_9b8 + 0x2c) * (long)local_ad0 * local_9b8[2];
          for (local_adc = 0; local_adc < local_9f8; local_adc = local_adc + 1) {
            local_780 = (long)local_adc;
            local_778 = &local_ab8;
            *(float *)(local_ad8 + (long)local_adc * 4) =
                 *(float *)(local_ad8 + (long)local_adc * 4) / (float)local_ab8[local_780];
          }
        }
        local_a58 = 0;
      }
      else {
        local_9a4 = -100;
        local_a58 = 1;
      }
      local_730 = &local_ab8;
      local_308 = local_730;
      if (local_ab0 != (int *)0x0) {
        local_30c = 0xffffffff;
        LOCK();
        local_310 = *local_ab0;
        *local_ab0 = *local_ab0 + -1;
        UNLOCK();
        if (local_310 == 1) {
          if (local_a98 == (long *)0x0) {
            local_300 = local_ab8;
            if (local_ab8 != (undefined4 *)0x0) {
              free(local_ab8);
            }
          }
          else {
            (**(code **)(*local_a98 + 0x18))(local_a98,local_ab8);
          }
        }
      }
      local_ab8 = (undefined4 *)0x0;
      local_aa8 = 0;
      local_aa0 = 0;
      local_a90 = 0;
      local_a8c = 0;
      local_a88 = 0;
      local_a84 = 0;
      local_a80 = 0;
      local_a78 = 0;
      local_ab0 = (int *)0x0;
    }
    else {
      local_9a4 = -100;
      local_a58 = 1;
    }
    local_720 = &local_a48;
    local_328 = local_720;
    if (local_a40 != (int *)0x0) {
      local_32c = 0xffffffff;
      LOCK();
      local_330 = *local_a40;
      *local_a40 = *local_a40 + -1;
      UNLOCK();
      if (local_330 == 1) {
        if (local_a28 == (long *)0x0) {
          local_2f0 = local_a48;
          if (local_a48 != (undefined4 *)0x0) {
            free(local_a48);
          }
        }
        else {
          (**(code **)(*local_a28 + 0x18))(local_a28,local_a48);
        }
      }
    }
    local_a48 = (undefined4 *)0x0;
    local_a38 = 0;
    local_a30 = 0;
    local_a20 = 0;
    local_a1c = 0;
    local_a18 = 0;
    local_a14 = 0;
    local_a10 = 0;
    local_a08 = 0;
    local_a40 = (int *)0x0;
    if (local_a58 != 0) {
      return local_9a4;
    }
  }
  if ((local_9c4 == 2) && (local_9d4 == 1)) {
    local_ae0 = *(int *)((long)local_9b8 + 0x2c);
    local_ae4 = (int)local_9b8[6];
    for (local_ae8 = 0; local_ae8 < local_ae4; local_ae8 = local_ae8 + 1) {
      local_808 = local_9b8;
      local_80c = local_ae8;
      local_af0 = *local_9b8 +
                  (long)*(int *)((long)local_9b8 + 0x2c) * (long)local_ae8 * local_9b8[2];
      local_af4 = -3.4028235e+38;
      for (local_af8 = 0; local_af8 < local_ae0; local_af8 = local_af8 + 1) {
        pfVar1 = std::max<float>(&local_af4,(float *)(local_af0 + (long)local_af8 * 4));
        local_af4 = *pfVar1;
      }
      local_afc = 0.0;
      for (local_b00 = 0; local_b00 < local_ae0; local_b00 = local_b00 + 1) {
        dVar2 = std::exp((double)(ulong)(uint)(*(float *)(local_af0 + (long)local_b00 * 4) -
                                              local_af4));
        *(int *)(local_af0 + (long)local_b00 * 4) = SUB84(dVar2,0);
        local_afc = *(float *)(local_af0 + (long)local_b00 * 4) + local_afc;
      }
      for (local_b04 = 0; local_b04 < local_ae0; local_b04 = local_b04 + 1) {
        *(float *)(local_af0 + (long)local_b04 * 4) =
             *(float *)(local_af0 + (long)local_b04 * 4) / local_afc;
      }
    }
  }
  if ((local_9c4 == 3) && (local_9d4 == 0)) {
    local_b08 = *(int *)((long)local_9b8 + 0x2c);
    local_b0c = (int)local_9b8[6];
    local_b10 = (int)local_9b8[7];
    local_b14 = local_b08 * local_b0c;
    local_960 = &local_b60;
    local_b60 = (undefined4 *)0x0;
    local_b58 = (int *)0x0;
    local_b50 = 0;
    local_b48 = 0;
    local_b40 = (long *)0x0;
    local_b38 = 0;
    local_b34 = 0;
    local_b30 = 0;
    local_b2c = 0;
    local_b28 = 0;
    local_b20 = 0;
    Mat::create(in_stack_ffffffffffffedf0,(int)((ulong)in_stack_ffffffffffffede8 >> 0x20),
                (int)in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    local_928 = &local_b60;
    if (local_b60 != (undefined4 *)0x0) {
      local_530 = local_928;
    }
    if (local_b60 != (undefined4 *)0x0 && local_b20 * local_b28 != 0) {
      local_898 = &local_b60;
      local_89c = 0xff7fffff;
      local_8a0 = (int)local_b20 * local_b28;
      local_8a8 = local_b60;
      for (local_8ac = 0; local_8ac < local_8a0; local_8ac = local_8ac + 1) {
        *local_8a8 = 0xff7fffff;
        local_8a8 = local_8a8 + 1;
      }
      local_560 = local_898;
      for (local_b64 = 0; local_b64 < local_b10; local_b64 = local_b64 + 1) {
        local_590 = &local_bb8;
        local_1cc = *(int *)((long)local_9b8 + 0x2c);
        local_1d0 = (int)local_9b8[6];
        local_1d4 = *(undefined4 *)((long)local_9b8 + 0x34);
        local_b70 = *local_9b8 + local_9b8[8] * (long)local_b64 * local_9b8[2];
        local_1e8 = local_9b8[2];
        local_1ec = (undefined4)local_9b8[3];
        local_1f8 = local_9b8[4];
        local_1c8 = &local_bb8;
        local_8 = (long)local_1cc * (long)local_1d0 * local_1e8;
        local_578 = &local_bb8;
        local_710 = &local_bb8;
        local_c = 0x10;
        local_59c = local_b64;
        local_59d = 1;
        local_bb8 = 0;
        local_ba8 = 0;
        local_ba0 = 0;
        local_b90 = 0;
        local_b8c = 0;
        local_b88 = 0;
        local_b84 = 0;
        local_b80 = 0;
        local_b78 = 0;
        local_bb0 = 0;
        local_348 = local_710;
        local_1e0 = local_b70;
        local_b98 = local_1f8;
        for (local_bbc = 0; local_bbc < local_b14; local_bbc = local_bbc + 1) {
          local_790 = (long)local_bbc;
          local_788 = &local_b60;
          pfVar1 = std::max<float>((float *)(local_b60 + local_790),
                                   (float *)(local_b70 + (long)local_bbc * 4));
          local_7a0 = (long)local_bbc;
          local_798 = &local_b60;
          local_b60[local_7a0] = *pfVar1;
        }
      }
      local_958 = &local_c08;
      local_c08 = (undefined4 *)0x0;
      local_c00 = (int *)0x0;
      local_bf8 = 0;
      local_bf0 = 0;
      local_be8 = (long *)0x0;
      local_be0 = 0;
      local_bdc = 0;
      local_bd8 = 0;
      local_bd4 = 0;
      local_bd0 = 0;
      local_bc8 = 0;
      Mat::create(in_stack_ffffffffffffedf0,(int)((ulong)in_stack_ffffffffffffede8 >> 0x20),
                  (int)in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8
                 );
      local_930 = &local_c08;
      if (local_c08 != (undefined4 *)0x0) {
        local_528 = local_930;
      }
      if (local_c08 != (undefined4 *)0x0 && local_bc8 * local_bd0 != 0) {
        local_8b8 = &local_c08;
        local_8bc = 0;
        local_8c0 = (int)local_bc8 * local_bd0;
        local_8c8 = local_c08;
        for (local_8cc = 0; local_8cc < local_8c0; local_8cc = local_8cc + 1) {
          *local_8c8 = 0;
          local_8c8 = local_8c8 + 1;
        }
        local_558 = local_8b8;
        for (local_c0c = 0; local_c0c < local_b10; local_c0c = local_c0c + 1) {
          local_5b0 = &local_c60;
          local_194 = *(int *)((long)local_9b8 + 0x2c);
          local_198 = (int)local_9b8[6];
          local_19c = *(undefined4 *)((long)local_9b8 + 0x34);
          local_c18 = *local_9b8 + local_9b8[8] * (long)local_c0c * local_9b8[2];
          local_1b0 = local_9b8[2];
          local_1b4 = (undefined4)local_9b8[3];
          local_1c0 = local_9b8[4];
          local_190 = &local_c60;
          local_18 = (long)local_194 * (long)local_198 * local_1b0;
          local_980 = &local_c60;
          local_700 = &local_c60;
          local_1c = 0x10;
          local_5bc = local_c0c;
          local_5bd = 1;
          local_c60 = 0;
          local_c50 = 0;
          local_c48 = 0;
          local_c38 = 0;
          local_c34 = 0;
          local_c30 = 0;
          local_c2c = 0;
          local_c28 = 0;
          local_c20 = 0;
          local_c58 = 0;
          local_368 = local_700;
          local_1a8 = local_c18;
          local_c40 = local_1c0;
          for (local_c64 = 0; local_c64 < local_b14; local_c64 = local_c64 + 1) {
            local_7b0 = (long)local_c64;
            local_7a8 = &local_b60;
            dVar2 = std::exp((double)(ulong)(uint)(*(float *)(local_c18 + (long)local_c64 * 4) -
                                                  (float)local_b60[local_7b0]));
            *(int *)(local_c18 + (long)local_c64 * 4) = SUB84(dVar2,0);
            local_7c0 = (long)local_c64;
            local_7b8 = &local_c08;
            local_c08[local_7c0] =
                 *(float *)(local_c18 + (long)local_c64 * 4) + (float)local_c08[local_7c0];
          }
        }
        for (local_c68 = 0; local_c68 < local_b10; local_c68 = local_c68 + 1) {
          local_5d0 = &local_cb8;
          local_15c = *(int *)((long)local_9b8 + 0x2c);
          local_160 = (int)local_9b8[6];
          local_164 = *(undefined4 *)((long)local_9b8 + 0x34);
          local_c70 = *local_9b8 + local_9b8[8] * (long)local_c68 * local_9b8[2];
          local_178 = local_9b8[2];
          local_17c = (undefined4)local_9b8[3];
          local_188 = local_9b8[4];
          local_158 = &local_cb8;
          local_28 = (long)local_15c * (long)local_160 * local_178;
          local_2c = 0x10;
          local_5dc = local_c68;
          local_5dd = 1;
          local_988 = &local_cb8;
          local_6f0 = &local_cb8;
          local_cb8 = 0;
          local_ca8 = 0;
          local_ca0 = 0;
          local_c90 = 0;
          local_c8c = 0;
          local_c88 = 0;
          local_c84 = 0;
          local_c80 = 0;
          local_c78 = 0;
          local_cb0 = 0;
          for (local_cbc = 0; local_cbc < local_b14; local_cbc = local_cbc + 1) {
            local_7d0 = (long)local_cbc;
            local_7c8 = &local_c08;
            *(float *)(local_c70 + (long)local_cbc * 4) =
                 *(float *)(local_c70 + (long)local_cbc * 4) / (float)local_c08[local_7d0];
          }
          local_388 = local_6f0;
          local_170 = local_c70;
          local_c98 = local_188;
        }
        local_a58 = 0;
      }
      else {
        local_9a4 = -100;
        local_a58 = 1;
      }
      local_6e0 = &local_c08;
      local_3a8 = local_6e0;
      if (local_c00 != (int *)0x0) {
        local_3ac = 0xffffffff;
        LOCK();
        local_3b0 = *local_c00;
        *local_c00 = *local_c00 + -1;
        UNLOCK();
        if (local_3b0 == 1) {
          if (local_be8 == (long *)0x0) {
            local_2b0 = local_c08;
            if (local_c08 != (undefined4 *)0x0) {
              free(local_c08);
            }
          }
          else {
            (**(code **)(*local_be8 + 0x18))(local_be8,local_c08);
          }
        }
      }
      local_c08 = (undefined4 *)0x0;
      local_bf8 = 0;
      local_bf0 = 0;
      local_be0 = 0;
      local_bdc = 0;
      local_bd8 = 0;
      local_bd4 = 0;
      local_bd0 = 0;
      local_bc8 = 0;
      local_c00 = (int *)0x0;
    }
    else {
      local_9a4 = -100;
      local_a58 = 1;
    }
    local_6d0 = &local_b60;
    local_3c8 = local_6d0;
    if (local_b58 != (int *)0x0) {
      local_3cc = 0xffffffff;
      LOCK();
      local_3d0 = *local_b58;
      *local_b58 = *local_b58 + -1;
      UNLOCK();
      if (local_3d0 == 1) {
        if (local_b40 == (long *)0x0) {
          local_2a0 = local_b60;
          if (local_b60 != (undefined4 *)0x0) {
            free(local_b60);
          }
        }
        else {
          (**(code **)(*local_b40 + 0x18))(local_b40,local_b60);
        }
      }
    }
    local_b60 = (undefined4 *)0x0;
    local_b50 = 0;
    local_b48 = 0;
    local_b38 = 0;
    local_b34 = 0;
    local_b30 = 0;
    local_b2c = 0;
    local_b28 = 0;
    local_b20 = 0;
    local_b58 = (int *)0x0;
    if (local_a58 != 0) {
      return local_9a4;
    }
  }
  if ((local_9c4 == 3) && (local_9d4 == 1)) {
    local_cc0 = *(int *)((long)local_9b8 + 0x2c);
    local_cc4 = (int)local_9b8[6];
    local_cc8 = (int)local_9b8[7];
    local_950 = &local_d10;
    local_d10 = (undefined4 *)0x0;
    local_d08 = (int *)0x0;
    local_d00 = 0;
    local_cf8 = 0;
    local_cf0 = (long *)0x0;
    local_ce8 = 0;
    local_ce4 = 0;
    local_ce0 = 0;
    local_cdc = 0;
    local_cd8 = 0;
    local_cd0 = 0;
    Mat::create(in_stack_ffffffffffffedf0,(int)((ulong)in_stack_ffffffffffffede8 >> 0x20),
                (int)in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    local_938 = &local_d10;
    if (local_d10 != (undefined4 *)0x0) {
      local_520 = local_938;
    }
    if (local_d10 != (undefined4 *)0x0 && local_cd0 * local_cd8 != 0) {
      local_8d8 = &local_d10;
      local_8dc = 0xff7fffff;
      local_8e0 = (int)local_cd0 * local_cd8;
      local_8e8 = local_d10;
      for (local_8ec = 0; local_8ec < local_8e0; local_8ec = local_8ec + 1) {
        *local_8e8 = 0xff7fffff;
        local_8e8 = local_8e8 + 1;
      }
      local_550 = local_8d8;
      for (local_d14 = 0; local_d14 < local_cc8; local_d14 = local_d14 + 1) {
        local_5f0 = &local_d68;
        local_124 = *(int *)((long)local_9b8 + 0x2c);
        local_128 = (int)local_9b8[6];
        local_12c = *(undefined4 *)((long)local_9b8 + 0x34);
        local_d20 = *local_9b8 + local_9b8[8] * (long)local_d14 * local_9b8[2];
        local_140 = local_9b8[2];
        local_144 = (undefined4)local_9b8[3];
        local_150 = local_9b8[4];
        local_120 = &local_d68;
        local_38 = (long)local_124 * (long)local_128 * local_140;
        local_580 = &local_d68;
        local_6c0 = &local_d68;
        local_3c = 0x10;
        local_5fc = local_d14;
        local_5fd = 1;
        local_d68 = 0;
        local_d58 = 0;
        local_d50 = 0;
        local_d40 = 0;
        local_d3c = 0;
        local_d38 = 0;
        local_d34 = 0;
        local_d30 = 0;
        local_d28 = 0;
        local_d60 = 0;
        local_818 = &local_d10;
        local_81c = local_d14;
        local_d70 = (undefined4 *)((long)local_d10 + (long)local_ce4 * (long)local_d14 * local_d00);
        local_3e8 = local_6c0;
        local_138 = local_d20;
        local_d48 = local_150;
        for (local_d74 = 0; local_d74 < local_cc4; local_d74 = local_d74 + 1) {
          for (local_d78 = 0; local_d78 < local_cc0; local_d78 = local_d78 + 1) {
            pfVar1 = std::max<float>((float *)(local_d70 + local_d78),
                                     (float *)(local_d20 + (long)local_d78 * 4));
            local_d70[local_d78] = *pfVar1;
          }
          local_d20 = local_d20 + (long)local_cc0 * 4;
        }
      }
      local_948 = &local_dc0;
      local_dc0 = (undefined4 *)0x0;
      local_db8 = (int *)0x0;
      local_db0 = 0;
      local_da8 = 0;
      local_da0 = (long *)0x0;
      local_d98 = 0;
      local_d94 = 0;
      local_d90 = 0;
      local_d8c = 0;
      local_d88 = 0;
      local_d80 = 0;
      Mat::create(in_stack_ffffffffffffedf0,(int)((ulong)in_stack_ffffffffffffede8 >> 0x20),
                  (int)in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8
                 );
      local_940 = &local_dc0;
      if (local_dc0 != (undefined4 *)0x0) {
        local_518 = local_940;
      }
      if (local_dc0 != (undefined4 *)0x0 && local_d80 * local_d88 != 0) {
        local_8f8 = &local_dc0;
        local_8fc = 0;
        local_900 = (int)local_d80 * local_d88;
        local_908 = local_dc0;
        for (local_90c = 0; local_90c < local_900; local_90c = local_90c + 1) {
          *local_908 = 0;
          local_908 = local_908 + 1;
        }
        local_548 = local_8f8;
        for (local_dc4 = 0; local_dc4 < local_cc8; local_dc4 = local_dc4 + 1) {
          local_610 = &local_e18;
          local_ec = *(int *)((long)local_9b8 + 0x2c);
          local_f0 = (int)local_9b8[6];
          local_f4 = *(undefined4 *)((long)local_9b8 + 0x34);
          local_dd0 = *local_9b8 + local_9b8[8] * (long)local_dc4 * local_9b8[2];
          local_108 = local_9b8[2];
          local_10c = (undefined4)local_9b8[3];
          local_118 = local_9b8[4];
          local_e8 = &local_e18;
          local_48 = (long)local_ec * (long)local_f0 * local_108;
          local_990 = &local_e18;
          local_6b0 = &local_e18;
          local_4c = 0x10;
          local_61c = local_dc4;
          local_61d = 1;
          local_e18 = 0;
          local_e08 = 0;
          local_e00 = 0;
          local_df0 = 0;
          local_dec = 0;
          local_de8 = 0;
          local_de4 = 0;
          local_de0 = 0;
          local_dd8 = 0;
          local_e10 = 0;
          local_828 = &local_d10;
          local_82c = local_dc4;
          local_e20 = (undefined4 *)
                      ((long)local_d10 + (long)local_ce4 * (long)local_dc4 * local_d00);
          local_838 = &local_dc0;
          local_83c = local_dc4;
          local_e28 = (undefined4 *)
                      ((long)local_dc0 + (long)local_d94 * (long)local_dc4 * local_db0);
          local_408 = local_6b0;
          local_100 = local_dd0;
          local_df8 = local_118;
          for (local_e2c = 0; local_e2c < local_cc4; local_e2c = local_e2c + 1) {
            for (local_e30 = 0; local_e30 < local_cc0; local_e30 = local_e30 + 1) {
              dVar2 = std::exp((double)(ulong)(uint)(*(float *)(local_dd0 + (long)local_e30 * 4) -
                                                    (float)local_e20[local_e30]));
              *(int *)(local_dd0 + (long)local_e30 * 4) = SUB84(dVar2,0);
              local_e28[local_e30] =
                   *(float *)(local_dd0 + (long)local_e30 * 4) + (float)local_e28[local_e30];
            }
            local_dd0 = local_dd0 + (long)local_cc0 * 4;
          }
        }
        for (local_e34 = 0; local_e34 < local_cc8; local_e34 = local_e34 + 1) {
          local_630 = &local_e88;
          local_b4 = *(int *)((long)local_9b8 + 0x2c);
          local_b8 = (int)local_9b8[6];
          local_bc = *(undefined4 *)((long)local_9b8 + 0x34);
          local_c8 = *local_9b8 + local_9b8[8] * (long)local_e34 * local_9b8[2];
          local_d0 = local_9b8[2];
          local_d4 = (undefined4)local_9b8[3];
          local_e0 = local_9b8[4];
          local_b0 = &local_e88;
          local_58 = (long)local_b4 * (long)local_b8 * local_d0;
          local_5c = 0x10;
          local_63c = local_e34;
          local_63d = 1;
          local_998 = &local_e88;
          local_6a0 = &local_e88;
          local_e88 = 0;
          local_e78 = 0;
          local_e70 = 0;
          local_e60 = 0;
          local_e5c = 0;
          local_e58 = 0;
          local_e54 = 0;
          local_e50 = 0;
          local_e48 = 0;
          local_e80 = 0;
          local_84c = local_e34;
          local_848 = &local_dc0;
          local_e90 = (undefined4 *)
                      ((long)local_dc0 + (long)local_d94 * (long)local_e34 * local_db0);
          local_e40 = local_c8;
          for (local_e94 = 0; local_e94 < local_cc4; local_e94 = local_e94 + 1) {
            for (local_e98 = 0; local_e98 < local_cc0; local_e98 = local_e98 + 1) {
              *(float *)(local_e40 + (long)local_e98 * 4) =
                   *(float *)(local_e40 + (long)local_e98 * 4) / (float)local_e90[local_e98];
            }
            local_e40 = local_e40 + (long)local_cc0 * 4;
          }
          local_428 = local_6a0;
          local_e68 = local_e0;
        }
        local_a58 = 0;
      }
      else {
        local_9a4 = -100;
        local_a58 = 1;
      }
      local_690 = &local_dc0;
      local_448 = local_690;
      if (local_db8 != (int *)0x0) {
        local_44c = 0xffffffff;
        LOCK();
        local_450 = *local_db8;
        *local_db8 = *local_db8 + -1;
        UNLOCK();
        if (local_450 == 1) {
          if (local_da0 == (long *)0x0) {
            local_260 = local_dc0;
            if (local_dc0 != (undefined4 *)0x0) {
              free(local_dc0);
            }
          }
          else {
            (**(code **)(*local_da0 + 0x18))(local_da0,local_dc0);
          }
        }
      }
      local_dc0 = (undefined4 *)0x0;
      local_db0 = 0;
      local_da8 = 0;
      local_d98 = 0;
      local_d94 = 0;
      local_d90 = 0;
      local_d8c = 0;
      local_d88 = 0;
      local_d80 = 0;
      local_db8 = (int *)0x0;
    }
    else {
      local_9a4 = -100;
      local_a58 = 1;
    }
    local_680 = &local_d10;
    local_468 = local_680;
    if (local_d08 != (int *)0x0) {
      local_46c = 0xffffffff;
      LOCK();
      local_470 = *local_d08;
      *local_d08 = *local_d08 + -1;
      UNLOCK();
      if (local_470 == 1) {
        if (local_cf0 == (long *)0x0) {
          local_250 = local_d10;
          if (local_d10 != (undefined4 *)0x0) {
            free(local_d10);
          }
        }
        else {
          (**(code **)(*local_cf0 + 0x18))(local_cf0,local_d10);
        }
      }
    }
    local_d10 = (undefined4 *)0x0;
    local_d00 = 0;
    local_cf8 = 0;
    local_ce8 = 0;
    local_ce4 = 0;
    local_ce0 = 0;
    local_cdc = 0;
    local_cd8 = 0;
    local_cd0 = 0;
    local_d08 = (int *)0x0;
    if (local_a58 != 0) {
      return local_9a4;
    }
  }
  if ((local_9c4 == 3) && (local_9d4 == 2)) {
    local_e9c = *(int *)((long)local_9b8 + 0x2c);
    local_ea0 = (int)local_9b8[6];
    local_ea4 = (int)local_9b8[7];
    for (local_ea8 = 0; local_ea8 < local_ea4; local_ea8 = local_ea8 + 1) {
      local_650 = &local_ef8;
      local_7c = *(int *)((long)local_9b8 + 0x2c);
      local_80 = (int)local_9b8[6];
      local_84 = *(undefined4 *)((long)local_9b8 + 0x34);
      local_eb0 = *local_9b8 + local_9b8[8] * (long)local_ea8 * local_9b8[2];
      local_98 = local_9b8[2];
      local_9c = (undefined4)local_9b8[3];
      local_a8 = local_9b8[4];
      local_78 = &local_ef8;
      local_68 = (long)local_7c * (long)local_80 * local_98;
      local_9a0 = &local_ef8;
      local_670 = &local_ef8;
      local_6c = 0x10;
      local_65c = local_ea8;
      local_65d = 1;
      local_ef8 = 0;
      local_ee8 = 0;
      local_ee0 = 0;
      local_ed0 = 0;
      local_ecc = 0;
      local_ec8 = 0;
      local_ec4 = 0;
      local_ec0 = 0;
      local_eb8 = 0;
      local_ef0 = 0;
      local_488 = local_670;
      local_90 = local_eb0;
      local_ed8 = local_a8;
      for (local_efc = 0; local_efc < local_ea0; local_efc = local_efc + 1) {
        local_f00 = -3.4028235e+38;
        for (local_f04 = 0; local_f04 < local_e9c; local_f04 = local_f04 + 1) {
          pfVar1 = std::max<float>(&local_f00,(float *)(local_eb0 + (long)local_f04 * 4));
          local_f00 = *pfVar1;
        }
        local_f08 = 0.0;
        for (local_f0c = 0; local_f0c < local_e9c; local_f0c = local_f0c + 1) {
          dVar2 = std::exp((double)(ulong)(uint)(*(float *)(local_eb0 + (long)local_f0c * 4) -
                                                local_f00));
          *(int *)(local_eb0 + (long)local_f0c * 4) = SUB84(dVar2,0);
          local_f08 = *(float *)(local_eb0 + (long)local_f0c * 4) + local_f08;
        }
        for (local_f10 = 0; local_f10 < local_e9c; local_f10 = local_f10 + 1) {
          *(float *)(local_eb0 + (long)local_f10 * 4) =
               *(float *)(local_eb0 + (long)local_f10 * 4) / local_f08;
        }
        local_eb0 = local_eb0 + (long)local_e9c * 4;
      }
    }
  }
  return 0;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i = 0; i < w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i = 0; i < w; i++)
        {
            ptr[i] = static_cast<float>(exp(ptr[i] - max));
            sum += ptr[i];
        }

        for (int i = 0; i < w; i++)
        {
            ptr[i] /= sum;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - max[j]));
                sum[j] += ptr[j];
            }
        }

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] /= sum[j];
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j = 0; j < w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - m));
                s += ptr[j];
            }

            for (int j = 0; j < w; j++)
            {
                ptr[j] /= s;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(exp(ptr[i] - max[i]));
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] /= sum[i];
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - maxptr[j]));
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                float max = -FLT_MAX;
                for (int j = 0; j < w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }
    }

    return 0;
}